

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledInputFile::TiledInputFile(TiledInputFile *this,char *fileName,int numThreads)

{
  bool bVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  _func_int *p_Var4;
  undefined8 uVar5;
  GenericInputFile *in_RDI;
  size_t i;
  stringstream _iex_replace_s;
  int *in_stack_00000110;
  IStream *in_stack_00000118;
  GenericInputFile *in_stack_00000120;
  BaseExc *e;
  IStream *is;
  int *in_stack_000003c0;
  IStream *in_stack_000003c8;
  Header *in_stack_000003d0;
  InputStreamMutex *in_stack_fffffffffffffdb0;
  IStream *in_stack_fffffffffffffdc8;
  TiledInputFile *in_stack_fffffffffffffdd0;
  undefined6 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffdde;
  undefined1 in_stack_fffffffffffffddf;
  StdIFStream *in_stack_fffffffffffffde0;
  IStream *in_stack_fffffffffffffde8;
  TileOffsets *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe08;
  int numThreads_00;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  TiledInputFile *in_stack_fffffffffffffe40;
  
  numThreads_00 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  GenericInputFile::GenericInputFile(in_RDI);
  in_RDI->_vptr_GenericInputFile = (_func_int **)&PTR__TiledInputFile_0040d890;
  pp_Var2 = (_func_int **)operator_new(0x180);
  Data::Data((Data *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),numThreads_00);
  in_RDI[1]._vptr_GenericInputFile = pp_Var2;
  in_RDI[1]._vptr_GenericInputFile[0x2e] = (_func_int *)0x0;
  *(undefined1 *)(in_RDI[1]._vptr_GenericInputFile + 0x2f) = 1;
  pvVar3 = operator_new(0x38);
  StdIFStream::StdIFStream
            (in_stack_fffffffffffffde0,
             (char *)CONCAT17(in_stack_fffffffffffffddf,
                              CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)));
  GenericInputFile::readMagicNumberAndVersionField
            (in_stack_00000120,in_stack_00000118,in_stack_00000110);
  bVar1 = isMultiPart(*(int *)(in_RDI[1]._vptr_GenericInputFile + 0xe));
  if (bVar1) {
    compatibilityInitialize(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  }
  else {
    p_Var4 = (_func_int *)operator_new(0x38);
    InputStreamMutex::InputStreamMutex(in_stack_fffffffffffffdb0);
    in_RDI[1]._vptr_GenericInputFile[0x2e] = p_Var4;
    *(void **)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x28) = pvVar3;
    Header::readFrom(in_stack_000003d0,in_stack_000003c8,in_stack_000003c0);
    initialize(in_stack_fffffffffffffe40);
    TileOffsets::readFrom
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(bool *)in_stack_fffffffffffffde0
               ,(bool)in_stack_fffffffffffffddf,(bool)in_stack_fffffffffffffdde);
    uVar5 = (**(code **)(**(long **)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x28) + 0x28))();
    *(undefined8 *)(in_RDI[1]._vptr_GenericInputFile[0x2e] + 0x30) = uVar5;
  }
  return;
}

Assistant:

TiledInputFile::TiledInputFile (const char fileName[], int numThreads):
    _data (new Data (numThreads))
{
    _data->_streamData=NULL;
    _data->_deleteStream=true;
    
    //
    // This constructor is called when a user
    // explicitly wants to read a tiled file.
    //


    IStream* is = 0;
    try
    {
        try
        {
            is = new StdIFStream (fileName);
            readMagicNumberAndVersionField(*is, _data->version);

            //
            // Backward compatibility to read multpart file.
            //
            if (isMultiPart(_data->version))
            {
                compatibilityInitialize(*is);
                return;
            }

            _data->_streamData = new InputStreamMutex();
            _data->_streamData->is = is;
            _data->header.readFrom (*_data->_streamData->is, _data->version);
            initialize();
            //read tile offsets - we are not multipart or deep
            _data->tileOffsets.readFrom (*(_data->_streamData->is), _data->fileIsComplete,false,false);
            _data->_streamData->currentPosition = _data->_streamData->is->tellg();
        }
        catch (IEX_NAMESPACE::BaseExc &e)
        {
            REPLACE_EXC (e, "Cannot open image file "
                    "\"" << fileName << "\". " << e.what());
            throw;
        }
    }
    catch (...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->tileBuffers.size(); i++)
            {
                if(_data->tileBuffers[i])
                {
                   delete [] _data->tileBuffers[i]->buffer;
                }
            }
        }
        if ( _data->_streamData != 0 && !isMultiPart(_data->version))
        {
            delete _data->_streamData->is;
            _data->_streamData->is = is = 0;
            delete _data->_streamData;
        }

        delete is;
        delete _data;
        throw;
    }
}